

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O3

ngram_model_t * ngram_model_trie_read_dmp(ps_config_t *config,char *file_name,logmath_t *lmath)

{
  long lVar1;
  logmath_t *lmath_00;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  ngram_model_t *base;
  lm_trie_t *plVar4;
  ngram_raw_t **raw_ngrams;
  char *pcVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  undefined8 unaff_RBP;
  uint uVar9;
  uint uVar10;
  uint32 unigram_count;
  size_t sVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  int32 k;
  int32 is_pipe;
  int32 vn;
  uint32 counts [3];
  int32 mapid;
  int32 ts;
  char str [1024];
  uint local_4a0;
  uint local_49c;
  float local_498;
  uint local_494;
  float local_490;
  float local_48c;
  uint local_488;
  int32 local_484;
  uint32 *local_480;
  logmath_t *local_478;
  int local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  uint local_460;
  uint32 local_45c;
  uint local_458;
  uint local_454;
  ulong local_450;
  ulong local_448;
  undefined1 local_440 [4];
  undefined1 local_43c [4];
  char local_438 [1032];
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,0x1cf,"Trying to read LM in dmp format\n");
  __stream = (FILE *)fopen_comp(file_name,"rb",&local_484);
  if (__stream == (FILE *)0x0) {
    pcVar5 = "Dump file %s not found\n";
    lVar6 = 0x1d1;
  }
  else {
    fread(&local_49c,4,1,__stream);
    uVar10 = local_49c;
    if (local_49c == 0x11) {
      uVar9 = 0x11;
      uVar8 = 0;
    }
    else {
      uVar9 = local_49c >> 0x18 | (local_49c & 0xff0000) >> 8 | (local_49c & 0xff00) << 8 |
              local_49c << 0x18;
      uVar8 = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      bVar13 = local_49c != 0x11000000;
      local_49c = uVar9;
      if (bVar13) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                ,0x1dc,"Wrong magic header size number %x: %s is not a dump file\n",(ulong)uVar9,
                file_name);
        return (ngram_model_t *)0x0;
      }
    }
    sVar11 = (size_t)(int)uVar9;
    sVar3 = fread(local_438,1,sVar11,__stream);
    if (sVar3 != sVar11) {
      pcVar5 = "Cannot read header\n";
      lVar6 = 0x1e2;
LAB_00110031:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
              ,lVar6,pcVar5);
      return (ngram_model_t *)0x0;
    }
    iVar2 = strncmp(local_438,"Darpa Trigram LM",sVar11);
    if (iVar2 == 0) {
      sVar3 = fread(&local_49c,4,1,__stream);
      if (sVar3 == 1) {
        if (uVar10 != 0x11) {
          local_49c = local_49c >> 0x18 | (local_49c & 0xff0000) >> 8 | (local_49c & 0xff00) << 8 |
                      local_49c << 0x18;
        }
        sVar11 = (size_t)(int)local_49c;
        sVar3 = fread(local_438,1,sVar11,__stream);
        if (sVar3 != sVar11) {
          pcVar5 = "Cannot read LM filename in header\n";
          lVar6 = 0x1ef;
          goto LAB_00110031;
        }
        sVar3 = fread(&local_460,4,1,__stream);
        if (sVar3 == 1) {
          uVar9 = local_460 >> 0x18 | (local_460 & 0xff0000) >> 8 | (local_460 & 0xff00) << 8 |
                  local_460 << 0x18;
          if (uVar10 == 0x11) {
            uVar9 = local_460;
          }
          uVar12 = (ulong)uVar9;
          local_464 = uVar8;
          if ((int)uVar9 < 1) {
            sVar3 = fread(local_43c,4,1,__stream);
            if (sVar3 == 1) {
              do {
                sVar3 = fread(&local_49c,4,1,__stream);
                if (sVar3 != 1) {
                  return (ngram_model_t *)0x0;
                }
                if (uVar10 != 0x11) {
                  local_49c = local_49c >> 0x18 | (local_49c & 0xff0000) >> 8 |
                              (local_49c & 0xff00) << 8 | local_49c << 0x18;
                }
                if (local_49c == 0) {
                  sVar3 = fread(&local_4a0,4,1,__stream);
                  if (sVar3 != 1) {
                    return (ngram_model_t *)0x0;
                  }
                  uVar12 = (ulong)local_4a0;
                  if (uVar10 != 0x11) {
                    local_4a0 = local_4a0 >> 0x18 | (local_4a0 & 0xff0000) >> 8 |
                                (local_4a0 & 0xff00) << 8 | local_4a0 << 0x18;
                    uVar12 = (ulong)local_4a0;
                  }
                  goto LAB_001100fe;
                }
                sVar11 = (size_t)(int)local_49c;
                sVar3 = fread(local_438,1,sVar11,__stream);
              } while (sVar3 == sVar11);
              pcVar5 = "Failed to read word\n";
              lVar6 = 0x208;
              goto LAB_00110031;
            }
          }
          else {
LAB_001100fe:
            unigram_count = (uint32)uVar12;
            local_45c = unigram_count;
            sVar3 = fread(&local_4a0,4,1,__stream);
            if (sVar3 == 1) {
              if (uVar10 != 0x11) {
                local_4a0 = local_4a0 >> 0x18 | (local_4a0 & 0xff0000) >> 8 |
                            (local_4a0 & 0xff00) << 8 | local_4a0 << 0x18;
              }
              uVar8 = local_4a0;
              local_458 = local_4a0;
              sVar3 = fread(&local_4a0,4,1,__stream);
              local_450 = 0;
              if (sVar3 == 1) {
                uVar9 = local_4a0 >> 0x18 | (local_4a0 & 0xff0000) >> 8 | (local_4a0 & 0xff00) << 8
                        | local_4a0 << 0x18;
                if (uVar10 == 0x11) {
                  uVar9 = local_4a0;
                }
                local_454 = uVar9;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                        ,0x221,"ngrams 1=%d, 2=%d, 3=%d\n",uVar12,(ulong)uVar8,uVar9);
                base = (ngram_model_t *)
                       __ckd_calloc__(1,0x68,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                                      ,0x223);
                local_470 = 3;
                if (uVar9 == 0) {
                  local_470 = 2 - (uint)(uVar8 == 0);
                }
                local_478 = lmath;
                local_46c = uVar9;
                local_468 = uVar8;
                ngram_model_init(base,&ngram_model_trie_funcs,lmath,local_470,unigram_count);
                plVar4 = lm_trie_create(unigram_count,local_470);
                *(lm_trie_t **)(base + 1) = plVar4;
                local_448 = uVar12;
                local_480 = (uint32 *)
                            __ckd_calloc__((long)(int)(unigram_count + 1),8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                                           ,0x231);
                do {
                  fread(local_440,4,1,__stream);
                  fread(&local_48c,4,1,__stream);
                  fread(&local_490,4,1,__stream);
                  fread(&local_488,4,1,__stream);
                  lmath_00 = local_478;
                  if (uVar10 == 0x11) {
                    local_498 = local_490;
                    local_494 = local_488;
                    fVar14 = local_48c;
                  }
                  else {
                    fVar14 = (float)((uint)local_48c >> 0x18 | ((uint)local_48c & 0xff0000) >> 8 |
                                     ((uint)local_48c & 0xff00) << 8 | (int)local_48c << 0x18);
                    local_498 = (float)((uint)local_490 >> 0x18 | ((uint)local_490 & 0xff0000) >> 8
                                        | ((uint)local_490 & 0xff00) << 8 | (int)local_490 << 0x18);
                    local_494 = local_488 >> 0x18 | (local_488 & 0xff0000) >> 8 |
                                (local_488 & 0xff00) << 8 | local_488 << 0x18;
                  }
                  fVar14 = logmath_log10_to_log_float(local_478,(float64)(double)fVar14);
                  iVar7 = (int)local_450;
                  uVar12 = local_450 & 0xffffffff;
                  lVar1 = uVar12 * 0xc;
                  *(float *)(*(long *)(*(long *)(base + 1) + 0x10) + lVar1) = fVar14;
                  fVar14 = logmath_log10_to_log_float(lmath_00,(float64)(double)local_498);
                  iVar2 = local_470;
                  lVar6 = *(long *)(*(long *)(base + 1) + 0x10);
                  *(float *)(lVar6 + 4 + lVar1) = fVar14;
                  *(uint *)(lVar6 + 8 + lVar1) = local_494;
                  local_480[uVar12] = local_494;
                  uVar8 = iVar7 + 1;
                  local_450 = (ulong)uVar8;
                } while (uVar8 <= (uint)local_448);
                uVar10 = local_464 & 0xff;
                if (local_46c != 0 || local_468 != 0) {
                  raw_ngrams = ngrams_raw_read_dmp((FILE *)__stream,local_478,&local_45c,local_470,
                                                   local_480,(uint8)local_464);
                  if (raw_ngrams == (ngram_raw_t **)0x0) {
                    ngram_model_free(base);
                    ckd_free(local_480);
                    fclose_comp((FILE *)__stream,local_484);
                    return (ngram_model_t *)0x0;
                  }
                  lm_trie_build(*(lm_trie_t **)(base + 1),raw_ngrams,&local_45c,base->n_counts,iVar2
                               );
                  ngrams_raw_free(raw_ngrams,&local_45c,iVar2);
                }
                ckd_free(local_480);
                read_word_str(base,(FILE *)__stream,uVar10);
                fclose_comp((FILE *)__stream,local_484);
                return base;
              }
            }
          }
        }
      }
      return (ngram_model_t *)0x0;
    }
    pcVar5 = "Wrong header %s: %s is not a dump file\n";
    file_name = "Darpa Trigram LM";
    lVar6 = 0x1e6;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,lVar6,pcVar5,file_name);
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ngram_model_trie_read_dmp(ps_config_t * config,
                          const char *file_name, logmath_t * lmath)
{
    uint8 do_swap;
    int32 is_pipe;
    int32 k;
    uint32 j;
    int32 vn, ts;
    int32 count;
    uint32 counts[3];
    uint32 *unigram_next;
    int order;
    char str[1024];
    FILE *fp;
    ngram_model_trie_t *model;
    ngram_model_t *base;
    ngram_raw_t **raw_ngrams;

    (void)config;
    E_INFO("Trying to read LM in dmp format\n");
    if ((fp = fopen_comp(file_name, "rb", &is_pipe)) == NULL) {
        E_ERROR("Dump file %s not found\n", file_name);
        return NULL;
    }

    do_swap = FALSE;
    fread(&k, sizeof(k), 1, fp);
    if (k != strlen(dmp_hdr) + 1) {
        SWAP_INT32(&k);
        if (k != strlen(dmp_hdr) + 1) {
            E_ERROR
                ("Wrong magic header size number %x: %s is not a dump file\n",
                 k, file_name);
            return NULL;
        }
        do_swap = 1;
    }
    if (fread(str, 1, k, fp) != (size_t) k) {
        E_ERROR("Cannot read header\n");
        return NULL;
    }
    if (strncmp(str, dmp_hdr, k) != 0) {
        E_ERROR("Wrong header %s: %s is not a dump file\n", dmp_hdr);
        return NULL;
    }

    if (fread(&k, sizeof(k), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&k);
    if (fread(str, 1, k, fp) != (size_t) k) {
        E_ERROR("Cannot read LM filename in header\n");
        return NULL;
    }

    /* read version#, if present (must be <= 0) */
    if (fread(&vn, sizeof(vn), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&vn);
    if (vn <= 0) {
        /* read and don't compare timestamps (we don't care) */
        if (fread(&ts, sizeof(ts), 1, fp) != 1)
            return NULL;
        if (do_swap)
            SWAP_INT32(&ts);

        /* read and skip format description */
        for (;;) {
            if (fread(&k, sizeof(k), 1, fp) != 1)
                return NULL;
            if (do_swap)
                SWAP_INT32(&k);
            if (k == 0)
                break;
            if (fread(str, 1, k, fp) != (size_t) k) {
                E_ERROR("Failed to read word\n");
                return NULL;
            }
        }
        /* read model->ucount */
        if (fread(&count, sizeof(count), 1, fp) != 1)
            return NULL;
        if (do_swap)
            SWAP_INT32(&count);
        counts[0] = count;
    }
    else {
        counts[0] = vn;
    }
    /* read model->bcount, tcount */
    if (fread(&count, sizeof(count), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&count);
    counts[1] = count;
    if (fread(&count, sizeof(count), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&count);
    counts[2] = count;
    E_INFO("ngrams 1=%d, 2=%d, 3=%d\n", counts[0], counts[1], counts[2]);

    model = (ngram_model_trie_t *) ckd_calloc(1, sizeof(*model));
    base = &model->base;
    if (counts[2] > 0)
        order = 3;
    else if (counts[1] > 0)
        order = 2;
    else
        order = 1;
    ngram_model_init(base, &ngram_model_trie_funcs, lmath, order,
                     (int32) counts[0]);

    model->trie = lm_trie_create(counts[0], order);

    unigram_next =
        (uint32 *) ckd_calloc((int32) counts[0] + 1, sizeof(unigram_next));
    for (j = 0; j <= counts[0]; j++) {
        int32 bigrams;
        int32 mapid;
        dmp_weight_t weightp;
        dmp_weight_t weightb;

        /* Skip over the mapping ID, we don't care about it. */
        /* Read the weights from actual unigram structure. */
        fread(&mapid, sizeof(int32), 1, fp);
        fread(&weightp, sizeof(weightp), 1, fp);
        fread(&weightb, sizeof(weightb), 1, fp);
        fread(&bigrams, sizeof(int32), 1, fp);
        if (do_swap) {
            SWAP_INT32(&weightp.l);
            SWAP_INT32(&weightb.l);
            SWAP_INT32(&bigrams);
        }
        model->trie->unigrams[j].prob = logmath_log10_to_log_float(lmath, weightp.f);
        model->trie->unigrams[j].bo = logmath_log10_to_log_float(lmath, weightb.f);
        model->trie->unigrams[j].next = bigrams;
        unigram_next[j] = bigrams;
    }

    if (order > 1) {
        raw_ngrams =
            ngrams_raw_read_dmp(fp, lmath, counts, order, unigram_next,
                                do_swap);
        if (raw_ngrams == NULL) {
            ngram_model_free(base);
            ckd_free(unigram_next);
            fclose_comp(fp, is_pipe);
            return NULL;
        }
        lm_trie_build(model->trie, raw_ngrams, counts, base->n_counts, order);        
        ngrams_raw_free(raw_ngrams, counts, order);
    }
    
    /* Sentinel unigram and bigrams read before */
    ckd_free(unigram_next);

    /* read ascii word strings */
    read_word_str(base, fp, do_swap);

    fclose_comp(fp, is_pipe);
    return base;
}